

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void * nn_msg_chunk_new(size_t size,nn_list *msg_array)

{
  nn_list_item *self_00;
  void *pvVar1;
  nn_list *in_RSI;
  size_t in_RDI;
  nn_chunkref *unaff_retaddr;
  msg_chunk *self;
  nn_list_item *item;
  
  self_00 = (nn_list_item *)nn_alloc_(0x174158);
  if (self_00 == (nn_list_item *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
            ,0xd3);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_chunkref_init(unaff_retaddr,in_RDI);
  nn_list_item_init(self_00);
  item = self_00;
  nn_list_end(in_RSI);
  nn_list_insert(in_RSI,item,self_00);
  pvVar1 = nn_chunkref_data((nn_chunkref *)(item + 1));
  return pvVar1;
}

Assistant:

void *nn_msg_chunk_new (size_t size, struct nn_list *msg_array)
{
    struct msg_chunk *self;

    self = nn_alloc (sizeof (struct msg_chunk), "msg_chunk");
    alloc_assert (self);

    nn_chunkref_init (&self->chunk, size);
    nn_list_item_init (&self->item);

    nn_list_insert (msg_array, &self->item, nn_list_end (msg_array));

    return nn_chunkref_data (&self->chunk);
}